

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall chatra::RuntimeImp::initialize(RuntimeImp *this,uint initialThreadCount)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<chatra::StringTable> sVar4;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  registerEmbeddedClasses(&this->classes);
  registerEmbeddedFunctions(&this->methods,&this->operators);
  sVar4 = StringTable::newInstance();
  p_Var3 = p_Stack_30;
  peVar2 = local_38;
  src = sVar4.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_38 = (element_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->primarySTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->primarySTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (this->primarySTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    src._M_pi = extraout_RDX;
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    src._M_pi = extraout_RDX_00;
  }
  StringTable::copy((StringTable *)&local_38,
                    (EVP_PKEY_CTX *)
                    (this->primarySTable).
                    super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (EVP_PKEY_CTX *)src._M_pi);
  p_Var3 = p_Stack_30;
  peVar2 = local_38;
  local_38 = (element_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->distributedSTable).
           super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->distributedSTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (this->distributedSTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  launchStorage(this);
  launchFinalizerThread(this);
  launchSystem(this,initialThreadCount);
  return;
}

Assistant:

void RuntimeImp::initialize(unsigned initialThreadCount) {
	registerEmbeddedClasses(classes);
	registerEmbeddedFunctions(methods, operators);

	primarySTable = StringTable::newInstance();
	distributedSTable = primarySTable->copy();

	launchStorage();
	launchFinalizerThread();
	launchSystem(initialThreadCount);
}